

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffimport_file(char *filename,char **contents,int *status)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  FILE *aFile;
  char line [256];
  char *local_40;
  char *lines;
  int eoline;
  int llen;
  int totalLen;
  int allocLen;
  int *status_local;
  char **contents_local;
  char *filename_local;
  
  bVar1 = true;
  if (*status < 1) {
    eoline = 0;
    llen = 0x400;
    local_40 = (char *)malloc(0x400);
    if (local_40 == (char *)0x0) {
      ffpmsg("Couldn\'t allocate memory to hold ASCII file contents.");
      *status = 0x71;
      filename_local._4_4_ = 0x71;
    }
    else {
      *local_40 = '\0';
      __stream = fopen(filename,"r");
      if (__stream == (FILE *)0x0) {
        snprintf((char *)&aFile,0x100,"Could not open ASCII file %s.",filename);
        ffpmsg((char *)&aFile);
        free(local_40);
        *status = 0x68;
        filename_local._4_4_ = 0x68;
      }
      else {
        while (pcVar3 = fgets((char *)&aFile,0x100,__stream), pcVar3 != (char *)0x0) {
          sVar4 = strlen((char *)&aFile);
          iVar2 = (int)sVar4;
          if ((((!bVar1) || (iVar2 < 2)) || ((char)aFile != '/')) || (aFile._1_1_ != '/')) {
            bVar1 = false;
            lines._4_4_ = iVar2;
            if ((0 < iVar2) &&
               ((line[(long)(iVar2 + -1) + -8] == '\n' || (line[(long)(iVar2 + -1) + -8] == '\r'))))
            {
              lines._4_4_ = iVar2 + -1;
              line[(long)lines._4_4_ + -8] = '\0';
              bVar1 = true;
              if ((0 < lines._4_4_) &&
                 ((line[(long)(iVar2 + -2) + -8] == '\n' || (line[(long)(iVar2 + -2) + -8] == '\r'))
                 )) {
                lines._4_4_ = iVar2 + -2;
                line[(long)lines._4_4_ + -8] = '\0';
              }
            }
            if (llen <= eoline + lines._4_4_ + 3) {
              llen = llen + 0x100;
              local_40 = (char *)realloc(local_40,(long)llen);
              if (local_40 == (char *)0x0) {
                ffpmsg("Couldn\'t allocate memory to hold ASCII file contents.");
                *status = 0x71;
                break;
              }
            }
            strcpy(local_40 + eoline,(char *)&aFile);
            eoline = lines._4_4_ + eoline;
            if (bVar1) {
              strcpy(local_40 + eoline," ");
              eoline = eoline + 1;
            }
          }
        }
        fclose(__stream);
        *contents = local_40;
        filename_local._4_4_ = *status;
      }
    }
  }
  else {
    filename_local._4_4_ = *status;
  }
  return filename_local._4_4_;
}

Assistant:

int ffimport_file( char *filename,   /* Text file to read                   */
                   char **contents,  /* Pointer to pointer to hold file     */
                   int *status )     /* CFITSIO error code                  */
/*
   Read and concatenate all the lines from the given text file.  User
   must free the pointer returned in contents.  Pointer is guaranteed
   to hold 2 characters more than the length of the text... allows the
   calling routine to append (or prepend) a newline (or quotes?) without
   reallocating memory.
*/
{
   int allocLen, totalLen, llen, eoline = 1;
   char *lines,line[256];
   FILE *aFile;

   if( *status > 0 ) return( *status );

   totalLen =    0;
   allocLen = 1024;
   lines    = (char *)malloc( allocLen * sizeof(char) );
   if( !lines ) {
      ffpmsg("Couldn't allocate memory to hold ASCII file contents.");
      return(*status = MEMORY_ALLOCATION );
   }
   lines[0] = '\0';

   if( (aFile = fopen( filename, "r" ))==NULL ) {
      snprintf(line,256,"Could not open ASCII file %s.",filename);
      ffpmsg(line);
      free( lines );
      return(*status = FILE_NOT_OPENED);
   }

   while( fgets(line,256,aFile)!=NULL ) {
      llen = strlen(line);
      if ( eoline && (llen > 1) && (line[0] == '/' && line[1] == '/'))
          continue;       /* skip comment lines begging with // */

      eoline = 0;

      /* replace CR and newline chars at end of line with nulls */
      if ((llen > 0) && (line[llen-1]=='\n' || line[llen-1] == '\r')) {
          line[--llen] = '\0';
          eoline = 1;   /* found an end of line character */

          if ((llen > 0) && (line[llen-1]=='\n' || line[llen-1] == '\r')) {
                 line[--llen] = '\0';
          }
      }

      if( totalLen + llen + 3 >= allocLen ) {
         allocLen += 256;
         lines = (char *)realloc(lines, allocLen * sizeof(char) );
         if( ! lines ) {
            ffpmsg("Couldn't allocate memory to hold ASCII file contents.");
            *status = MEMORY_ALLOCATION;
            break;
         }
      }
      strcpy( lines+totalLen, line );
      totalLen += llen;

      if (eoline) {
         strcpy( lines+totalLen, " "); /* add a space between lines */
         totalLen += 1;
      }
   }
   fclose(aFile);

   *contents = lines;
   return( *status );
}